

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  pointer pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *log;
  undefined1 auVar3 [16];
  size_t **ppsVar4;
  LineInterpolationMethod LVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  float *pfVar9;
  size_t *psVar10;
  ulong *puVar11;
  size_type *psVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  LineInterpolationTest *pLVar16;
  undefined8 uVar17;
  pointer pVVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  float extraout_XMM0_Da;
  float fVar23;
  undefined4 extraout_XMM0_Da_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  Vec4 colors [3];
  undefined1 local_2a8 [32];
  string local_288;
  LineInterpolationTest *local_268;
  float local_25c;
  undefined1 local_258 [32];
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_238;
  Surface local_218;
  long lStack_200;
  string local_1f8;
  ScopedLogSection local_1d8;
  RasterizationArguments local_1cc;
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  float local_198 [2];
  undefined1 *puStack_190;
  float local_188 [2];
  float afStack_180 [14];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar6 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar6 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0x1c103d9);
  ppsVar4 = (size_t **)&local_218.m_pixels.m_cap;
  psVar10 = (size_t *)(plVar7 + 2);
  if ((size_t *)*plVar7 == psVar10) {
    local_218.m_pixels.m_cap = *psVar10;
    lStack_200 = plVar7[3];
    local_218._0_8_ = ppsVar4;
  }
  else {
    local_218.m_pixels.m_cap = *psVar10;
    local_218._0_8_ = (size_t *)*plVar7;
  }
  local_218.m_pixels.m_ptr = (void *)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_218);
  paVar2 = &local_288.field_2;
  puVar11 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_288.field_2._M_allocated_capacity = *puVar11;
    local_288.field_2._8_8_ = plVar7[3];
    local_288._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *puVar11;
    local_288._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_288._M_string_length = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  pVVar1 = (pointer)((long)(float *)local_258._8_8_ + local_288._M_string_length);
  uVar17 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    uVar17 = local_288.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < pVVar1) {
    pVVar18 = (pointer)0xf;
    if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
      pVVar18 = (pointer)local_258._16_8_;
    }
    if (pVVar18 < pVVar1) goto LAB_0108d0ce;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_258,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
  }
  else {
LAB_0108d0ce:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,local_258._0_8_);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1f8.field_2._M_allocated_capacity = *psVar12;
    local_1f8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = *psVar12;
    local_1f8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1f8._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((pointer)local_258._0_8_ != (pointer)(local_258 + 0x10)) {
    operator_delete((void *)local_258._0_8_,(ulong)((long)(float *)local_258._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((size_t **)local_218._0_8_ != ppsVar4) {
    operator_delete((void *)local_218._0_8_,local_218.m_pixels.m_cap + 1);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar6 = this->m_iteration;
  local_268 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,iVar6 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x1c10744);
  pLVar16 = local_268;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_288.field_2._M_allocated_capacity = *psVar12;
    local_288.field_2._8_8_ = plVar7[3];
    local_288._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar12;
    local_288._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_288._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d8,log,&local_288,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((size_t **)local_218._0_8_ != ppsVar4) {
    operator_delete((void *)local_218._0_8_,local_218.m_pixels.m_cap + 1);
  }
  (*(pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(pLVar16);
  iVar6 = (pLVar16->super_BaseRenderingCase).m_renderSize;
  local_25c = extraout_XMM0_Da;
  tcu::Surface::Surface(&local_218,iVar6,iVar6);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pLVar16->m_maxLineWidth < local_25c) {
    local_1b8 = (undefined1  [8])
                ((pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)local_25c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1b0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
    std::ios_base::~ios_base(local_140);
    goto LAB_0108dc05;
  }
  local_1b8 = (undefined1  [8])0x3f800000;
  pp_Stack_1b0 = (_func_int **)0x3f80000000000000;
  local_1a8._M_allocated_capacity = 0x3f80000000000000;
  local_1a8._8_8_ = 0x3f80000000000000;
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  puStack_190 = &DAT_3f8000003f800000;
  deRandom_init((deRandom *)&local_288,
                pLVar16->m_iteration * 1000 + *(int *)&(pLVar16->super_BaseRenderingCase).field_0xc4
                + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_258,6);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    lVar19 = 0;
    uVar21 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar21;
      fVar23 = deRandom_getFloat((deRandom *)&local_288);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar19) = fVar23 * 1.8 + -0.9;
      fVar23 = deRandom_getFloat((deRandom *)&local_288);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 4) = fVar23 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_2a8._0_8_ + lVar19 + 8) = 0;
      fVar23 = 1.0;
      if (pLVar16->m_projective == true) {
        fVar23 = deRandom_getFloat((deRandom *)&local_288);
        fVar23 = fVar23 * 3.8 + 0.2;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar19) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar19) * fVar23;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 4) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 4) * fVar23;
        *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 8) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 8) * fVar23;
      }
      *(float *)((long)(float *)local_2a8._0_8_ + lVar19 + 0xc) = fVar23;
      uVar17 = *(undefined8 *)
                ((long)(local_1b8 +
                       lVar19 + (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe
                                ) * -0x18) + 8);
      puVar8 = (undefined8 *)((long)(float *)local_258._0_8_ + lVar19);
      *puVar8 = *(undefined8 *)
                 (local_1b8 +
                 lVar19 + (SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                          -0x18);
      puVar8[1] = uVar17;
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 0x10;
    } while ((long)uVar21 < (long)(int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  iVar6 = *(int *)&(pLVar16->super_BaseRenderingCase).field_0xc4;
  if (iVar6 == 1) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      iVar6 = 0;
      do {
        local_1b8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + (long)iVar6 * 0x10))->m_data;
        pp_Stack_1b0 = *(_func_int ***)
                        (((pointer)(local_2a8._0_8_ + (long)iVar6 * 0x10))->m_data + 2);
        iVar14 = iVar6 + 1;
        local_1a8._M_allocated_capacity =
             *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)iVar14 * 0x10))->m_data;
        local_1a8._8_8_ =
             *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)iVar14 * 0x10))->m_data + 2);
        if ((local_268->super_BaseRenderingCase).m_flatshade == true) {
          local_198 = *(float (*) [2])((pointer)(local_258._0_8_ + (long)iVar14 * 0x10))->m_data;
          puStack_190 = *(undefined1 **)
                         (((pointer)(local_258._0_8_ + (long)iVar14 * 0x10))->m_data + 2);
        }
        else {
          local_198 = *(float (*) [2])((pointer)(local_258._0_8_ + (long)iVar6 * 0x10))->m_data;
          puStack_190 = *(undefined1 **)
                         (((pointer)(local_258._0_8_ + (long)iVar6 * 0x10))->m_data + 2);
        }
        local_188 = *(float (*) [2])((pointer)(local_258._0_8_ + (long)iVar14 * 0x10))->m_data;
        afStack_180._0_8_ =
             *(undefined8 *)(((pointer)(local_258._0_8_ + (long)iVar14 * 0x10))->m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_238,(value_type *)local_1b8);
        iVar6 = iVar6 + 2;
      } while (iVar6 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1);
    }
  }
  else if (iVar6 == 3) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      lVar19 = 0x10;
      lVar20 = 0;
      do {
        puVar8 = (undefined8 *)((long)((pointer)(local_2a8._0_8_ + -0x10))->m_data + lVar19);
        local_1b8 = (undefined1  [8])*puVar8;
        pp_Stack_1b0 = (_func_int **)puVar8[1];
        lVar20 = lVar20 + 1;
        psVar12 = (size_type *)((long)(float *)local_2a8._0_8_ + lVar19);
        local_1a8._M_allocated_capacity = *psVar12;
        local_1a8._8_8_ = psVar12[1];
        if ((local_268->super_BaseRenderingCase).m_flatshade == true) {
          pfVar9 = (float *)((long)(float *)local_258._0_8_ + lVar19);
          local_198 = *(float (*) [2])pfVar9;
          puStack_190 = *(undefined1 **)(pfVar9 + 2);
          lVar13 = lVar19;
        }
        else {
          pfVar9 = (float *)((long)((pointer)(local_258._0_8_ + -0x10))->m_data + lVar19);
          local_198 = *(float (*) [2])pfVar9;
          puStack_190 = *(undefined1 **)(pfVar9 + 2);
          lVar13 = lVar20 * 0x10;
        }
        pfVar9 = (float *)((long)(float *)local_258._0_8_ + lVar13);
        local_188 = *(float (*) [2])pfVar9;
        afStack_180._0_8_ = *(undefined8 *)(pfVar9 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_238,(value_type *)local_1b8);
        lVar19 = lVar19 + 0x10;
      } while (lVar20 < (local_2a8._8_8_ - local_2a8._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  else if ((iVar6 == 2) &&
          (uVar21 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4, 0 < (int)uVar21)) {
    iVar6 = 0;
    do {
      uVar15 = (long)iVar6 % (long)(int)uVar21 & 0xffffffff;
      local_1b8 = *(undefined1 (*) [8])((pointer)(local_2a8._0_8_ + uVar15 * 0x10))->m_data;
      pp_Stack_1b0 = *(_func_int ***)(((pointer)(local_2a8._0_8_ + uVar15 * 0x10))->m_data + 2);
      iVar6 = iVar6 + 1;
      uVar21 = (long)iVar6 % (long)(int)uVar21 & 0xffffffff;
      local_1a8._M_allocated_capacity =
           *(undefined8 *)((pointer)(local_2a8._0_8_ + uVar21 * 0x10))->m_data;
      local_1a8._8_8_ = *(undefined8 *)(((pointer)(local_2a8._0_8_ + uVar21 * 0x10))->m_data + 2);
      if ((local_268->super_BaseRenderingCase).m_flatshade == true) {
        local_198 = *(float (*) [2])((pointer)(local_258._0_8_ + uVar21 * 0x10))->m_data;
        puStack_190 = *(undefined1 **)(((pointer)(local_258._0_8_ + uVar21 * 0x10))->m_data + 2);
      }
      else {
        local_198 = *(float (*) [2])((pointer)(local_258._0_8_ + uVar15 * 0x10))->m_data;
        puStack_190 = *(undefined1 **)(((pointer)(local_258._0_8_ + uVar15 * 0x10))->m_data + 2);
      }
      local_188 = *(float (*) [2])((pointer)(local_258._0_8_ + uVar21 * 0x10))->m_data;
      afStack_180._0_8_ = *(undefined8 *)(((pointer)(local_258._0_8_ + uVar21 * 0x10))->m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back(&local_238,(value_type *)local_1b8);
      uVar21 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4;
    } while (iVar6 < (int)uVar21);
  }
  local_1b8 = (undefined1  [8])
              ((local_268->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      local_1b8 = (undefined1  [8])
                  ((local_268->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                  .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,"\t",1);
      tcu::operator<<((ostream *)&pp_Stack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_2a8._0_8_ + lVar19));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1b0,",\tcolor= ",9);
      tcu::operator<<((ostream *)&pp_Stack_1b0,
                      (Vector<float,_4> *)((long)(float *)local_258._0_8_ + lVar19));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar20 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  pLVar16 = local_268;
  BaseRenderingCase::drawPrimitives
            (&local_268->super_BaseRenderingCase,&local_218,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_258,
             *(GLenum *)&(local_268->super_BaseRenderingCase).field_0xc4);
  local_1cc.numSamples = (pLVar16->super_BaseRenderingCase).m_numSamples;
  local_1cc.subpixelBits = (pLVar16->super_BaseRenderingCase).m_subpixelBits;
  local_1cc.redBits = (pLVar16->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_1cc.greenBits = (pLVar16->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_1cc.blueBits = (pLVar16->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_288._M_dataplus._M_p =
       (pointer)local_238.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_288._M_string_length =
       (size_type)
       local_238.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_288.field_2._M_allocated_capacity =
       (size_type)
       local_238.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(pLVar16);
  local_288.field_2._8_4_ = extraout_XMM0_Da_00;
  LVar5 = tcu::verifyLineGroupInterpolation
                    (&local_218,(LineSceneSpec *)&local_288,&local_1cc,
                     ((pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  if (LVar5 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
    tcu::ResultCollector::addResult(&pLVar16->m_result,QP_TEST_RESULT_PASS,(string *)local_1b8);
LAB_0108dbd1:
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
  }
  else {
    if (LVar5 == LINEINTERPOLATION_PROJECTED) {
      local_1b8 = (undefined1  [8])
                  ((pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,
                 "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
                 ,0xb1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      local_1b8 = (undefined1  [8])&local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Interpolation was calculated using projected coordinateds","")
      ;
      tcu::ResultCollector::addResult
                (&pLVar16->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1b8);
      goto LAB_0108dbd1;
    }
    if (LVar5 == LINEINTERPOLATION_INCORRECT) {
      if ((((float)local_288.field_2._8_4_ == 1.0) && (!NAN((float)local_288.field_2._8_4_))) ||
         ((pLVar16->super_BaseRenderingCase).m_numSamples < 2)) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Found invalid pixel values","");
        tcu::ResultCollector::addResult(&pLVar16->m_result,QP_TEST_RESULT_FAIL,(string *)local_1b8);
      }
      else {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Interpolation of multisampled wide lines failed","");
        tcu::ResultCollector::addResult
                  (&pLVar16->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_1b8);
      }
      goto LAB_0108dbd1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_288._M_dataplus._M_p,
                    local_288.field_2._M_allocated_capacity - (long)local_288._M_dataplus._M_p);
  }
LAB_0108dc05:
  iVar6 = pLVar16->m_iteration + 1;
  pLVar16->m_iteration = iVar6;
  bVar22 = iVar6 != pLVar16->m_iterationCount;
  if (!bVar22) {
    tcu::ResultCollector::setTestContextResult
              (&pLVar16->m_result,
               (pLVar16->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  if (local_238.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_258._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ - local_258._0_8_);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  tcu::Surface::~Surface(&local_218);
  tcu::TestLog::endSection(local_1d8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar22;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;
			LineInterpolationMethod	iterationResult;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
			switch (iterationResult)
			{
				case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
					// line interpolation matches the specification
					m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
					break;

				case tcu::LINEINTERPOLATION_PROJECTED:
					// line interpolation weights are otherwise correct, but they are projected onto major axis
					m_testCtx.getLog()	<< tcu::TestLog::Message
										<< "Interpolation was calculated using coordinates projected onto major axis. "
										"This method does not produce the same values as the non-projecting method defined in the specification."
										<< tcu::TestLog::EndMessage;
					m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
					break;

				case tcu::LINEINTERPOLATION_INCORRECT:
					if (scene.lineWidth != 1.0f && m_numSamples > 1)
					{
						// multisampled wide lines might not be supported
						m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
					}
					else
					{
						// line interpolation is incorrect
						m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}